

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_socket_bind(lws_vhost *vhost,lws_sockfd_type sockfd,int port,char *iface,int ipv6_allowed)

{
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  sockaddr_in sain;
  int _lws_errno;
  sockaddr *v;
  sockaddr_storage sin;
  int m;
  int n;
  socklen_t len;
  sockaddr_in serv_addr4;
  int ipv6_allowed_local;
  char *iface_local;
  int port_local;
  lws_sockfd_type sockfd_local;
  lws_vhost *vhost_local;
  
  m = 0x80;
  serv_addr4.sin_zero._0_4_ = ipv6_allowed;
  unique0x1000018d = iface;
  memset(&v,0,0x80);
  sin.__ss_align._4_4_ = 0x10;
  memset(&n,0,0x10);
  len = 0;
  n._0_2_ = 2;
  if (stack0xffffffffffffffd8 != (char *)0x0) {
    sin.__ss_align._0_4_ =
         interface_to_sa(vhost,stack0xffffffffffffffd8,(sockaddr_in *)&n,
                         (long)(int)sin.__ss_align._4_4_,0);
    if ((int)sin.__ss_align == -2) {
      _lws_log(8,"%s: netif %s: Not usable\n","lws_socket_bind",stack0xffffffffffffffd8);
      return (int)sin.__ss_align;
    }
    if ((int)sin.__ss_align == -1) {
      _lws_log(8,"%s: netif %s: Does not exist\n","lws_socket_bind",stack0xffffffffffffffd8);
      return (int)sin.__ss_align;
    }
  }
  n._2_2_ = htons((uint16_t)port);
  if (sockfd == -1) {
    vhost_local._4_4_ = 0;
  }
  else {
    sin.__ss_align._4_4_ = bind(sockfd,(sockaddr *)&n,sin.__ss_align._4_4_);
    if ((int)sin.__ss_align._4_4_ < 0) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      _lws_log(1,"ERROR on binding fd %d to port %d (%d %d)\n",(ulong)(uint)sockfd,(ulong)(uint)port
               ,(ulong)sin.__ss_align._4_4_,(ulong)uVar1);
      if (uVar1 == 0x62) {
        vhost_local._4_4_ = 0xfffffffd;
      }
      else {
        vhost_local._4_4_ = 0xffffffff;
      }
    }
    else {
      iVar3 = getsockname(sockfd,(sockaddr *)&v,(socklen_t *)&m);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        _lws_log(2,"getsockname: %s\n",pcVar6);
        iface_local._0_4_ = port;
      }
      else {
        uVar2 = ntohs(v._2_2_);
        iface_local._0_4_ = (uint)uVar2;
      }
      vhost_local._4_4_ = (uint)iface_local;
    }
  }
  return vhost_local._4_4_;
}

Assistant:

int
lws_socket_bind(struct lws_vhost *vhost, lws_sockfd_type sockfd, int port,
		const char *iface, int ipv6_allowed)
{
#ifdef LWS_WITH_UNIX_SOCK
	struct sockaddr_un serv_unix;
#endif
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 serv_addr6;
#endif
	struct sockaddr_in serv_addr4;
#ifndef LWS_PLAT_OPTEE
	socklen_t len = sizeof(struct sockaddr_storage);
#endif
	int n;
#if !defined(LWS_PLAT_FREERTOS) && !defined(LWS_PLAT_OPTEE)
	int m;
#endif
	struct sockaddr_storage sin;
	struct sockaddr *v;

	memset(&sin, 0, sizeof(sin));

#if defined(LWS_WITH_UNIX_SOCK)
	if (!port && LWS_UNIX_SOCK_ENABLED(vhost)) {
		v = (struct sockaddr *)&serv_unix;
		n = sizeof(struct sockaddr_un);
		memset(&serv_unix, 0, sizeof(serv_unix));
		serv_unix.sun_family = AF_UNIX;
		if (!iface)
			return LWS_ITOSA_NOT_EXIST;
		if (sizeof(serv_unix.sun_path) <= strlen(iface)) {
			lwsl_err("\"%s\" too long for UNIX domain socket\n",
			         iface);
			return LWS_ITOSA_NOT_EXIST;
		}
		strcpy(serv_unix.sun_path, iface);
		if (serv_unix.sun_path[0] == '@')
			serv_unix.sun_path[0] = '\0';
		else
			unlink(serv_unix.sun_path);

	} else
#endif
#if defined(LWS_WITH_IPV6) && !defined(LWS_PLAT_FREERTOS)
	if (ipv6_allowed && LWS_IPV6_ENABLED(vhost)) {
		v = (struct sockaddr *)&serv_addr6;
		n = sizeof(struct sockaddr_in6);
		memset(&serv_addr6, 0, sizeof(serv_addr6));
		if (iface) {
			m = interface_to_sa(vhost, iface,
				    (struct sockaddr_in *)v, n, 1);
			if (m == LWS_ITOSA_NOT_USABLE) {
				lwsl_info("%s: netif %s: Not usable\n",
					 __func__, iface);
				return m;
			}
			if (m == LWS_ITOSA_NOT_EXIST) {
				lwsl_info("%s: netif %s: Does not exist\n",
					 __func__, iface);
				return m;
			}
			serv_addr6.sin6_scope_id = lws_get_addr_scope(iface);
		}

		serv_addr6.sin6_family = AF_INET6;
		serv_addr6.sin6_port = htons(port);
	} else
#endif
	{
		v = (struct sockaddr *)&serv_addr4;
		n = sizeof(serv_addr4);
		memset(&serv_addr4, 0, sizeof(serv_addr4));
		serv_addr4.sin_addr.s_addr = INADDR_ANY;
		serv_addr4.sin_family = AF_INET;

#if !defined(LWS_PLAT_FREERTOS) && !defined(LWS_PLAT_OPTEE)
		if (iface) {
		    m = interface_to_sa(vhost, iface,
				    (struct sockaddr_in *)v, n, 0);
			if (m == LWS_ITOSA_NOT_USABLE) {
				lwsl_info("%s: netif %s: Not usable\n",
					 __func__, iface);
				return m;
			}
			if (m == LWS_ITOSA_NOT_EXIST) {
				lwsl_info("%s: netif %s: Does not exist\n",
					 __func__, iface);
				return m;
			}
		}
#endif
		serv_addr4.sin_port = htons(port);
	} /* ipv4 */

	/* just checking for the interface extant */
	if (sockfd == LWS_SOCK_INVALID)
		return LWS_ITOSA_USABLE;

	n = bind(sockfd, v, n);
#ifdef LWS_WITH_UNIX_SOCK
	if (n < 0 && LWS_UNIX_SOCK_ENABLED(vhost)) {
		lwsl_err("ERROR on binding fd %d to \"%s\" (%d %d)\n",
			 sockfd, iface, n, LWS_ERRNO);
		return LWS_ITOSA_NOT_EXIST;
	} else
#endif
	if (n < 0) {
		int _lws_errno = LWS_ERRNO;

		lwsl_err("ERROR on binding fd %d to port %d (%d %d)\n",
			 sockfd, port, n, _lws_errno);

		/* if something already listening, tell caller to fail permanently */

		if (_lws_errno == LWS_EADDRINUSE)
			return LWS_ITOSA_BUSY;

		/* otherwise ask caller to retry later */

		return LWS_ITOSA_NOT_EXIST;
	}

#if defined(LWS_WITH_UNIX_SOCK)
	if (LWS_UNIX_SOCK_ENABLED(vhost)) {
		uid_t uid = vhost->context->uid;
		gid_t gid = vhost->context->gid;

		if (vhost->unix_socket_perms) {
			if (lws_plat_user_colon_group_to_ids(
				vhost->unix_socket_perms, &uid, &gid)) {
				lwsl_err("%s: Failed to translate %s\n",
					  __func__, vhost->unix_socket_perms);
				return LWS_ITOSA_NOT_EXIST;
			}
		}
		if (uid && gid) {
			if (chown(serv_unix.sun_path, uid, gid)) {
				lwsl_err("%s: failed to set %s perms %u:%u\n",
					 __func__, serv_unix.sun_path,
					 (unsigned int)uid, (unsigned int)gid);

				return LWS_ITOSA_NOT_EXIST;
			}
			lwsl_notice("%s: vh %s unix skt %s perms %u:%u\n",
				    __func__, vhost->name, serv_unix.sun_path,
				    (unsigned int)uid, (unsigned int)gid);

			if (chmod(serv_unix.sun_path, 0660)) {
				lwsl_err("%s: failed to set %s to 0600 mode\n",
					 __func__, serv_unix.sun_path);

				return LWS_ITOSA_NOT_EXIST;
			}
		}
	}
#endif

#ifndef LWS_PLAT_OPTEE
	if (getsockname(sockfd, (struct sockaddr *)&sin, &len) == -1)
		lwsl_warn("getsockname: %s\n", strerror(LWS_ERRNO));
	else
#endif
#if defined(LWS_WITH_IPV6)
		port = (sin.ss_family == AF_INET6) ?
			ntohs(((struct sockaddr_in6 *) &sin)->sin6_port) :
			ntohs(((struct sockaddr_in *) &sin)->sin_port);
#else
		{
			struct sockaddr_in sain;
			memcpy(&sain, &sin, sizeof(sain));
			port = ntohs(sain.sin_port);
		}
#endif

	return port;
}